

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

FStateLabel * __thiscall FStateLabels::FindLabel(FStateLabels *this,FName *label)

{
  int max;
  FStateLabel *pFVar1;
  FName local_1c;
  FName *local_18;
  FName *label_local;
  FStateLabels *this_local;
  
  max = this->NumLabels;
  local_18 = label;
  label_local = (FName *)this;
  FName::FName(&local_1c,label);
  pFVar1 = BinarySearch<FStateLabel,FName>(this->Labels,max,0,&local_1c);
  return pFVar1;
}

Assistant:

FStateLabel *FStateLabels::FindLabel (FName label)
{
	return const_cast<FStateLabel *>(BinarySearch<FStateLabel, FName>(Labels, NumLabels, &FStateLabel::Label, label));
}